

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_simd.h
# Opt level: O3

void __thiscall ImplSimd<SimdAVX>::AlphaBlend(ImplSimd<SimdAVX> *this,RGB *rgb,uint8_t alpha)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  ulong uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  
  if ((rgb->size_ & 0xf) != 0) {
    __assert_fail("rgb->size_ % kStride == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                  ,0x5b,
                  "virtual void ImplSimd<SimdAVX>::AlphaBlend(RGB *, uint8_t) [SIMD = SimdAVX]");
  }
  if (rgb->size_ != 0) {
    puVar7 = rgb->r_;
    puVar8 = rgb->g_;
    puVar9 = rgb->b_;
    auVar11[1] = 0;
    auVar11[0] = alpha;
    auVar11[2] = alpha;
    auVar11[3] = 0;
    auVar11[4] = alpha;
    auVar11[5] = 0;
    auVar11[6] = alpha;
    auVar11[7] = 0;
    auVar11[8] = alpha;
    auVar11[9] = 0;
    auVar11[10] = alpha;
    auVar11[0xb] = 0;
    auVar11[0xc] = alpha;
    auVar11[0xd] = 0;
    auVar11[0xe] = alpha;
    auVar11[0xf] = 0;
    auVar11[0x10] = alpha;
    auVar11[0x11] = 0;
    auVar11[0x12] = alpha;
    auVar11[0x13] = 0;
    auVar11[0x14] = alpha;
    auVar11[0x15] = 0;
    auVar11[0x16] = alpha;
    auVar11[0x17] = 0;
    auVar11[0x18] = alpha;
    auVar11[0x19] = 0;
    auVar11[0x1a] = alpha;
    auVar11[0x1b] = 0;
    auVar11[0x1c] = alpha;
    auVar11[0x1d] = 0;
    auVar11[0x1e] = alpha;
    auVar11[0x1f] = 0;
    uVar10 = 0;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)(puVar7 + uVar10);
      auVar1 = vpmovzxbw_avx(auVar1);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(puVar7 + uVar10 + 8);
      auVar2 = vpmovzxbw_avx(auVar2);
      auVar12._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar1;
      auVar12._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(ulong *)(puVar8 + uVar10);
      auVar1 = vpmovzxbw_avx(auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)(puVar8 + uVar10 + 8);
      auVar2 = vpmovzxbw_avx(auVar4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)(puVar9 + uVar10);
      auVar3 = vpmovzxbw_avx(auVar5);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)(puVar9 + uVar10 + 8);
      auVar4 = vpmovzxbw_avx(auVar6);
      auVar13._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar1;
      auVar13._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
      auVar14._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar3;
      auVar14._16_16_ = ZEXT116(1) * auVar4;
      auVar12 = vpmullw_avx2(auVar11,auVar12);
      auVar12 = vpsraw_avx2(auVar12,8);
      auVar1 = vpacksswb_avx(auVar12._0_16_,auVar12._16_16_);
      *(undefined1 (*) [16])(puVar7 + uVar10) = auVar1;
      auVar12 = vpmullw_avx2(auVar11,auVar13);
      auVar12 = vpsraw_avx2(auVar12,8);
      auVar1 = vpacksswb_avx(auVar12._0_16_,auVar12._16_16_);
      *(undefined1 (*) [16])(puVar8 + uVar10) = auVar1;
      auVar12 = vpmullw_avx2(auVar11,auVar14);
      auVar12 = vpsraw_avx2(auVar12,8);
      auVar1 = vpacksswb_avx(auVar12._0_16_,auVar12._16_16_);
      *(undefined1 (*) [16])(puVar9 + uVar10) = auVar1;
      uVar10 = uVar10 + 0x10;
    } while (uVar10 < rgb->size_);
  }
  return;
}

Assistant:

void ImplSimd<SIMD>::AlphaBlend(RGB *rgb, uint8_t alpha) {
  assert(rgb->size_ % kStride == 0);

  auto r = rgb->r_;
  auto g = rgb->g_;
  auto b = rgb->b_;

  Vector const_alpha = cn(alpha);

  for(size_t i = 0; i < rgb->size_; i += kStride){
    Vector c = load(r+i);
    Vector d = load(g+i);
    Vector e = load(b+i);
    /*
    r[i] = (uint32_t)alpha * r[i] >> 8;
    g[i] = (uint32_t)alpha * g[i] >> 8;
    b[i] = (uint32_t)alpha * b[i] >> 8;
     */
    store(rli(mul(const_alpha, c),8),r+i);
    store(rli(mul(const_alpha, d),8),g+i);
    store(rli(mul(const_alpha, e),8),b+i);
    SIMD::Empty();
  }
}